

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

int GetCombinedHistogramEntropy
              (VP8LHistogram *a,VP8LHistogram *b,int64_t cost_threshold_in,uint64_t *cost,
              uint64_t *costs)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t cost_threshold;
  long lVar3;
  bool bVar4;
  int length;
  uint64_t *local_80;
  ulong local_78;
  uint32_t *Y;
  uint32_t *X;
  VP8LBitEntropy bit_entropy;
  VP8LStreaks stats;
  
  if (cost_threshold_in < 1) {
    return 0;
  }
  *cost = 0;
  lVar3 = 0;
  local_80 = costs;
  local_78 = cost_threshold_in;
  do {
    if (lVar3 == 5) {
      return 1;
    }
    if (a->trivial_symbol[lVar3] == 0xffff) {
      bVar4 = true;
    }
    else {
      bVar4 = a->trivial_symbol[lVar3] != b->trivial_symbol[lVar3];
    }
    if (((bVar4) && (a->is_used[lVar3] != '\0')) && (b->is_used[lVar3] != '\0')) {
      GetPopulationInfo(a,(HistogramIndex)lVar3,&X,&length);
      GetPopulationInfo(b,(HistogramIndex)lVar3,&Y,&length);
      (*VP8LGetCombinedEntropyUnrefined)(X,Y,length,&bit_entropy,&stats);
      uVar1 = BitsEntropyRefine(&bit_entropy);
      uVar2 = FinalHuffmanCost(&stats);
      uVar2 = uVar2 + uVar1;
      cost_threshold_in = local_78;
      costs = local_80;
    }
    else if (a->is_used[lVar3] == '\0') {
      uVar2 = b->costs[lVar3];
    }
    else {
      uVar2 = a->costs[lVar3];
    }
    costs[lVar3] = uVar2;
    uVar1 = *cost;
    *cost = uVar2 + uVar1;
    lVar3 = lVar3 + 1;
  } while (uVar2 + uVar1 < (ulong)cost_threshold_in);
  return 0;
}

Assistant:

WEBP_NODISCARD static int GetCombinedHistogramEntropy(
    const VP8LHistogram* const a, const VP8LHistogram* const b,
    int64_t cost_threshold_in, uint64_t* cost, uint64_t costs[5]) {
  int i;
  const uint64_t cost_threshold = (uint64_t)cost_threshold_in;
  assert(a->palette_code_bits == b->palette_code_bits);
  if (cost_threshold_in <= 0) return 0;
  *cost = 0;

  // No need to add the extra cost for length and distance as it is a constant
  // that does not influence the histograms.
  for (i = 0; i < 5; ++i) {
    costs[i] = GetCombinedEntropy(a, b, (HistogramIndex)i);
    *cost += costs[i];
    if (*cost >= cost_threshold) return 0;
  }

  return 1;
}